

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O0

void __thiscall
moira::StrWriter::fullExtension<(moira::Mode)10,(moira::Size)4>
          (StrWriter *this,Ea<(moira::Mode)10,_(moira::Size)4> *ea)

{
  long in_RSI;
  StrWriter *in_RDI;
  bool comma;
  bool effectiveZero;
  bool postindex;
  bool preindex;
  u32 outer;
  u32 base;
  u16 iis;
  u16 is;
  u16 bs;
  u16 scale;
  u16 lw;
  u16 reg;
  StrWriter *in_stack_ffffffffffffffa8;
  undefined3 in_stack_ffffffffffffffb4;
  Int i;
  bool local_3d;
  Rn in_stack_ffffffffffffffc4;
  Scale local_38 [2];
  Rn local_30;
  Int local_2c;
  byte local_28;
  char local_27;
  byte local_26;
  bool local_25;
  int local_24;
  int local_20;
  ushort local_1c;
  ushort local_1a;
  ushort local_18;
  ushort local_16;
  ushort local_14;
  ushort local_12;
  
  local_12 = (ushort)(*(uint *)(in_RSI + 8) >> 0xc) & 0xf;
  local_14 = (ushort)(*(uint *)(in_RSI + 8) >> 0xb) & 1;
  local_16 = (ushort)(*(uint *)(in_RSI + 8) >> 9) & 3;
  local_18 = (ushort)(*(uint *)(in_RSI + 8) >> 7) & 1;
  local_1a = (ushort)(*(uint *)(in_RSI + 8) >> 6) & 1;
  local_1c = (ushort)*(uint *)(in_RSI + 8) & 7;
  local_20 = *(int *)(in_RSI + 0xc);
  local_24 = *(int *)(in_RSI + 0x10);
  local_3d = (*(uint *)(in_RSI + 8) & 7) != 0 && local_1c < 4;
  local_25 = local_3d;
  local_26 = 4 < local_1c;
  i.raw = CONCAT13(1,in_stack_ffffffffffffffb4);
  if ((*(uint *)(in_RSI + 8) & 0xe4) != 0xc4) {
    i.raw = CONCAT13((*(uint *)(in_RSI + 8) & 0xe2) == 0xc0,in_stack_ffffffffffffffb4);
  }
  local_27 = (char)((uint)i.raw >> 0x18);
  if (local_27 == '\0') {
    operator<<(in_RDI,"(");
    local_28 = 0;
    if (((local_25 & 1U) != 0) || ((local_26 & 1) != 0)) {
      operator<<(in_RDI,"[");
    }
    if (local_20 != 0) {
      Int::Int(&local_2c,(int)(short)local_20);
      operator<<(in_stack_ffffffffffffffa8,i);
      local_28 = 1;
    }
    if (local_18 == 0) {
      if ((local_28 & 1) != 0) {
        operator<<(in_RDI,",");
      }
      operator<<(in_RDI,"PC");
      local_28 = 1;
    }
    if ((local_26 & 1) != 0) {
      operator<<(in_RDI,"]");
      local_28 = 1;
    }
    if (local_1a == 0) {
      if ((local_28 & 1) != 0) {
        operator<<(in_RDI,",");
      }
      Rn::Rn(&local_30,(uint)local_12);
      operator<<(in_RDI,in_stack_ffffffffffffffc4);
      if (local_14 == 0) {
        operator<<(in_RDI);
      }
      else {
        operator<<(in_RDI);
      }
      Scale::Scale(local_38,(uint)local_16);
      operator<<(in_RDI,local_38[0]);
      local_28 = 1;
    }
    if ((local_25 & 1U) != 0) {
      operator<<(in_RDI,"]");
      local_28 = 1;
    }
    if (local_24 != 0) {
      if ((local_28 & 1) != 0) {
        operator<<(in_RDI,",");
      }
      Int::Int((Int *)&stack0xffffffffffffffc4,(int)(short)local_24);
      operator<<(in_stack_ffffffffffffffa8,i);
    }
    operator<<(in_RDI,")");
  }
  else {
    operator<<(in_RDI,"0");
  }
  return;
}

Assistant:

void
StrWriter::fullExtension(const Ea<M,S> &ea)
{
    assert(M == 6 || M == 10);

    //   15 - 12    11   10   09   08   07   06   05   04   03   02   01   00
    // -----------------------------------------------------------------------
    // | REGISTER | LW | SCALE   | 1  | BS | IS | BD SIZE  | 0  | IIS        |
    // -----------------------------------------------------------------------

    u16  reg   = xxxx____________ (ea.ext1);
    u16  lw    = ____x___________ (ea.ext1);
    u16  scale = _____xx_________ (ea.ext1);
    u16  bs    = ________x_______ (ea.ext1);
    u16  is    = _________x______ (ea.ext1);
    u16  iis   = _____________xxx (ea.ext1);
    u32  base  = ea.ext2;
    u32  outer = ea.ext3;

    bool preindex      = (iis > 0 && iis < 4);
    bool postindex     = (iis > 4);
    bool effectiveZero = (ea.ext1 & 0xe4) == 0xC4 || (ea.ext1 & 0xe2) == 0xC0;

    if (effectiveZero) {
        *this << "0";
        return;
    }

    *this << "(";

    bool comma = false;
    if (preindex || postindex)
    {
        *this << "[";
    }
    if (base)
    {
        *this << Int{(i16)base};
        comma = true;
    }
    if (!bs)
    {
        if (comma) *this << ",";
        M == 10 ? *this << "PC" : *this << An{ea.reg};
        comma = true;
    }
    if (postindex)
    {
        *this << "]";
        comma = true;
    }
    if (!is)
    {
        if (comma) *this << ",";
        *this << Rn{reg};
        lw ? (*this << Sz<Long>{}) : (*this << Sz<Word>{});
        *this << Scale{scale};
        comma = true;
    }
    if (preindex)
    {
        *this << "]";
        comma = true;
    }
    if(outer)
    {
        if (comma) *this << ",";
        *this << Int((i16)outer);
    }

    *this << ")";
}